

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npp.cpp
# Opt level: O0

bool __thiscall pg::NPPSolver::atronsubgameup(NPPSolver *this)

{
  uint vertex;
  value_type pos;
  list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  bool bVar1;
  uint uVar2;
  reference ppbVar3;
  reference pplVar4;
  reference this_01;
  reference puVar5;
  int iVar6;
  bool local_361;
  bool local_351;
  bool local_341;
  int local_334;
  char local_319;
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [24];
  iterator diter;
  iterator dend;
  deque<unsigned_int,_std::allocator<unsigned_int>_> *rdeque;
  iterator liter;
  iterator lend;
  list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *entries;
  bitset *supgame;
  NPPSolver *this_local;
  char local_231;
  undefined1 local_230 [16];
  undefined1 local_220 [24];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [28];
  int from;
  int *curedge_2;
  reference local_1c0;
  deque<unsigned_int,_std::allocator<unsigned_int>_> *entries_1;
  bitset *supgame_2;
  NPPSolver *local_1a8;
  uint local_19c;
  uintqueue *local_198;
  uint local_18c;
  uintqueue *local_188;
  undefined1 local_180 [16];
  undefined1 local_170 [28];
  int to;
  int *curedge;
  NPPSolver *local_148;
  char local_139;
  undefined1 local_138 [24];
  bitset *exits_1;
  undefined1 local_110 [16];
  undefined1 local_100 [28];
  int to_2;
  int *curedge_3;
  bitset *supgame_3;
  NPPSolver *local_d0;
  char local_c5;
  uint local_c4;
  uintqueue *local_c0;
  uintqueue *local_b8;
  uintqueue *local_b0;
  undefined1 local_a8 [24];
  bitset *exits;
  undefined1 local_80 [16];
  undefined1 local_70 [28];
  int to_1;
  int *curedge_1;
  bitset *supgame_1;
  NPPSolver *local_40;
  char local_35;
  uint local_34;
  uintqueue *local_30;
  uintqueue *local_28;
  uintqueue *local_20;
  uintqueue *local_18;
  uintqueue *local_10;
  
  ppbVar3 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                      (&this->Supgame,(ulong)this->Top);
  pos = *ppbVar3;
  pplVar4 = std::
            vector<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
            ::operator[](&this->Entries,(ulong)this->Pivot);
  this_00 = *pplVar4;
  liter = std::__cxx11::
          list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::end(this_00);
  rdeque = (deque<unsigned_int,_std::allocator<unsigned_int>_> *)
           std::__cxx11::
           list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin(this_00);
  do {
    bVar1 = std::operator!=((_Self *)&rdeque,&liter);
    if (!bVar1) {
      if ((this->T).pointer == 0) {
        this_local._3_1_ = false;
      }
      else {
        do {
          iVar6 = (this->T).pointer + -1;
          (this->T).pointer = iVar6;
          supgame_2._4_4_ = (this->T).queue[iVar6];
          local_1a8 = this;
          ppbVar3 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                              (&this->Supgame,(ulong)this->Top);
          entries_1 = (deque<unsigned_int,_std::allocator<unsigned_int>_> *)*ppbVar3;
          pplVar4 = std::
                    vector<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
                    ::operator[](&this->Entries,(ulong)this->Pivot);
          curedge_2 = (int *)std::__cxx11::
                             list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ::begin(*pplVar4);
          local_1c0 = std::_List_iterator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                      ::operator*((_List_iterator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)&curedge_2);
          for (register0x00000000 = (uint *)Solver::ins(&this->super_Solver,supgame_2._4_4_);
              *stack0xfffffffffffffe30 != 0xffffffff;
              register0x00000000 = stack0xfffffffffffffe30 + 1) {
            local_1e8._20_4_ = *stack0xfffffffffffffe30;
            bitset::operator[]((bitset *)local_1e8,(size_t)&this->outgame);
            bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_1e8);
            local_351 = true;
            if (!bVar1) {
              bitset::operator[]((bitset *)local_1f8,(size_t)&this->R);
              local_351 = bitset::reference::operator_cast_to_bool((reference *)local_1f8);
            }
            if (local_351 == false) {
              bitset::operator[]((bitset *)local_208,(size_t)entries_1);
              bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_208);
              if (bVar1) {
                local_220._20_4_ = local_1e8._20_4_;
                std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          (local_1c0,(value_type_conflict4 *)(local_220 + 0x14));
              }
              else {
                uVar2 = Solver::owner(&this->super_Solver,local_1e8._20_4_);
                if (uVar2 == this->alpha) {
                  bitset::operator[]((bitset *)local_220,(size_t)&this->R);
                  bitset::reference::operator=((reference *)local_220,true);
                  this->strategy[(int)local_1e8._20_4_] = supgame_2._4_4_;
                  local_188 = &this->T;
                  local_18c = local_1e8._20_4_;
                  iVar6 = (this->T).pointer;
                  (this->T).pointer = iVar6 + 1;
                  local_188->queue[iVar6] = local_1e8._20_4_;
                }
                else {
                  supgame_3._4_4_ = local_1e8._20_4_;
                  local_d0 = this;
                  ppbVar3 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                                      (&this->Supgame,(ulong)this->Top);
                  curedge_3 = (int *)*ppbVar3;
                  for (register0x00000000 =
                            (uint *)Solver::outs(&this->super_Solver,supgame_3._4_4_);
                      *stack0xffffffffffffff18 != 0xffffffff;
                      register0x00000000 = stack0xffffffffffffff18 + 1) {
                    local_100._20_4_ = *stack0xffffffffffffff18;
                    bitset::operator[]((bitset *)local_100,(size_t)&this->outgame);
                    bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_100);
                    local_361 = true;
                    if (!bVar1) {
                      bitset::operator[]((bitset *)local_110,(size_t)&this->R);
                      local_361 = bitset::reference::operator_cast_to_bool((reference *)local_110);
                    }
                    if (local_361 == false) {
                      bitset::operator[]((bitset *)&exits_1,(size_t)curedge_3);
                      bVar1 = bitset::reference::operator_cast_to_bool((reference *)&exits_1);
                      if (!bVar1) {
                        local_10 = &this->E;
                        (this->E).pointer = 0;
                        local_c5 = '\0';
                        goto LAB_001d1710;
                      }
                      local_c0 = &this->E;
                      local_c4 = local_100._20_4_;
                      iVar6 = (this->E).pointer;
                      (this->E).pointer = iVar6 + 1;
                      local_c0->queue[iVar6] = local_100._20_4_;
                    }
                  }
                  ppbVar3 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                                      (&this->Exits,(ulong)this->Pivot);
                  local_138._16_8_ = *ppbVar3;
                  while (local_b8 = &this->E, (this->E).pointer != 0) {
                    local_b0 = &this->E;
                    (this->E).pointer = (this->E).pointer + -1;
                    bitset::operator[]((bitset *)local_138,local_138._16_8_);
                    bitset::reference::operator=((reference *)local_138,true);
                  }
                  this->strategy[supgame_3._4_4_] = -1;
                  local_c5 = '\x01';
LAB_001d1710:
                  if (local_c5 != '\0') {
                    bitset::operator[]((bitset *)local_230,(size_t)&this->R);
                    bitset::reference::operator=((reference *)local_230,true);
                    local_198 = &this->T;
                    local_19c = local_1e8._20_4_;
                    iVar6 = (this->T).pointer;
                    (this->T).pointer = iVar6 + 1;
                    local_198->queue[iVar6] = local_1e8._20_4_;
                  }
                }
              }
            }
          }
        } while ((this->T).pointer != 0);
        this_local._3_1_ = true;
      }
      return this_local._3_1_;
    }
    this_01 = std::_List_iterator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator*((_List_iterator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                        &rdeque);
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::end((iterator *)&diter._M_node,this_01)
    ;
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::begin
              ((iterator *)(local_2f0 + 0x10),this_01);
    while (bVar1 = std::operator!=((_Self *)(local_2f0 + 0x10),(_Self *)&diter._M_node), bVar1) {
      puVar5 = std::_Deque_iterator<unsigned_int,_unsigned_int_&,_unsigned_int_*>::operator*
                         ((_Deque_iterator<unsigned_int,_unsigned_int_&,_unsigned_int_*> *)
                          (local_2f0 + 0x10));
      this->pos = *puVar5;
      bitset::operator[]((bitset *)local_2f0,(size_t)pos);
      bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_2f0);
      local_319 = '\0';
      if (!bVar1) {
        bitset::operator[]((bitset *)local_300,(size_t)&this->R);
        bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_300);
        local_319 = '\0';
        if (!bVar1) {
          vertex = this->pos;
          uVar2 = Solver::owner(&this->super_Solver,vertex);
          if (uVar2 == this->alpha) {
            curedge._4_4_ = vertex;
            local_148 = this;
            for (register0x00000000 = Solver::outs(&this->super_Solver,vertex);
                *stack0xfffffffffffffea8 != -1; register0x00000000 = stack0xfffffffffffffea8 + 1) {
              local_170._20_4_ = *stack0xfffffffffffffea8;
              bitset::operator[]((bitset *)local_170,(size_t)&this->R);
              bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_170);
              if (bVar1) {
                bitset::operator[]((bitset *)local_180,(size_t)&this->R);
                bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_180);
                if ((bVar1) && (this->strategy[curedge._4_4_] != -1)) {
                  local_334 = this->strategy[curedge._4_4_];
                }
                else {
                  local_334 = local_170._20_4_;
                }
                this->strategy[curedge._4_4_] = local_334;
                local_139 = '\x01';
                goto LAB_001d0f36;
              }
            }
            local_139 = '\0';
LAB_001d0f36:
            local_231 = local_139;
          }
          else {
            supgame_1._4_4_ = vertex;
            local_40 = this;
            ppbVar3 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                                (&this->Supgame,(ulong)this->Top);
            curedge_1 = (int *)*ppbVar3;
            for (register0x00000000 = (uint *)Solver::outs(&this->super_Solver,supgame_1._4_4_);
                *stack0xffffffffffffffa8 != 0xffffffff;
                register0x00000000 = stack0xffffffffffffffa8 + 1) {
              local_70._20_4_ = *stack0xffffffffffffffa8;
              bitset::operator[]((bitset *)local_70,(size_t)&this->outgame);
              bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_70);
              local_341 = true;
              if (!bVar1) {
                bitset::operator[]((bitset *)local_80,(size_t)&this->R);
                local_341 = bitset::reference::operator_cast_to_bool((reference *)local_80);
              }
              if (local_341 == false) {
                bitset::operator[]((bitset *)&exits,(size_t)curedge_1);
                bVar1 = bitset::reference::operator_cast_to_bool((reference *)&exits);
                if (!bVar1) {
                  local_18 = &this->E;
                  (this->E).pointer = 0;
                  local_35 = '\0';
                  goto LAB_001d1156;
                }
                local_30 = &this->E;
                local_34 = local_70._20_4_;
                iVar6 = (this->E).pointer;
                (this->E).pointer = iVar6 + 1;
                local_30->queue[iVar6] = local_70._20_4_;
              }
            }
            ppbVar3 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                                (&this->Exits,(ulong)this->Pivot);
            local_a8._16_8_ = *ppbVar3;
            while (local_28 = &this->E, (this->E).pointer != 0) {
              local_20 = &this->E;
              (this->E).pointer = (this->E).pointer + -1;
              bitset::operator[]((bitset *)local_a8,local_a8._16_8_);
              bitset::reference::operator=((reference *)local_a8,true);
            }
            this->strategy[supgame_1._4_4_] = -1;
            local_35 = '\x01';
LAB_001d1156:
            local_231 = local_35;
          }
          local_319 = local_231;
        }
      }
      if (local_319 != '\0') {
        bitset::operator[]((bitset *)local_310,(size_t)&this->R);
        bitset::reference::operator=((reference *)local_310,true);
        uVar2 = this->pos;
        iVar6 = (this->T).pointer;
        (this->T).pointer = iVar6 + 1;
        (this->T).queue[iVar6] = uVar2;
      }
      std::_Deque_iterator<unsigned_int,_unsigned_int_&,_unsigned_int_*>::operator++
                ((_Deque_iterator<unsigned_int,_unsigned_int_&,_unsigned_int_*> *)(local_2f0 + 0x10)
                );
    }
    std::_List_iterator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::operator++
              ((_List_iterator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)&rdeque);
  } while( true );
}

Assistant:

bool NPPSolver::atronsubgameup()
{
    auto & supgame = *(Supgame[Top]);
    auto & entries = *(Entries[Pivot]);
    auto lend = entries.end();
    for (auto liter = entries.begin(); liter != lend; ++liter)
    {
        auto & rdeque = *liter;
        auto dend = rdeque.end();
        for (auto diter = rdeque.begin(); diter != dend; ++diter)
        {
            pos = *diter;
            if (!supgame[pos] && !R[pos] && isclosedonsubgame(pos))
            {
                R[pos] = true;
                T.push(pos);
            }
        }
    }
    if (T.nonempty())
    {
        do
        {
            pushinqueueonsubgameup(T.pop());
        }
        while (T.nonempty());
        return (true);
    }
    else
    {
        return (false);
    }
}